

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O2

shared_ptr<libtorrent::peer_plugin> __thiscall
libtorrent::anon_unknown_5::ut_metadata_plugin::new_connection
          (ut_metadata_plugin *this,peer_connection_handle *pc)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  connection_type cVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  peer_connection_handle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  *puVar4;
  shared_ptr<libtorrent::peer_plugin> sVar5;
  __allocator_type __a2;
  unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  cVar2 = peer_connection_handle::type(in_RDX);
  if (cVar2 == bittorrent) {
    ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc0);
    local_48 = local_40;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffc8);
    p_Var1 = (pc->m_connection).
             super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
    local_40 = (element_type *)&stack0xffffffffffffffa7;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x100000001;
    (((torrent *)_Var3._M_pi)->super_request_callback)._vptr_request_callback =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_004d1ae8;
    puVar4 = &(((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_hash_picker;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_torrent_file.
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_torrent_file.
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_hash_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl =
         (hash_picker *)&PTR__ut_metadata_peer_plugin_004d1b38;
    *(undefined4 *)&(((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_size_on_disk = 0;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_ses =
         (session_interface *)0x8000000000000000;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_peer_list._M_t.
    super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
    .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl = (peer_list *)0x0;
    (((torrent *)_Var3._M_pi)->super_peer_class_set).m_size = '\0';
    *(undefined3 *)&(((torrent *)_Var3._M_pi)->super_peer_class_set).field_0x1 = 0;
    (((torrent *)_Var3._M_pi)->super_peer_class_set).m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems[0] = 0;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_connections.
    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    .
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(((torrent *)_Var3._M_pi)->super_torrent_hot_members).field_0x48 = 0;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_connections.
    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    .
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_connections.
    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    .
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((((torrent *)_Var3._M_pi)->super_peer_class_set).m_class.
      super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
      ._M_elems + 1) = p_Var1;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)
     ((((torrent *)_Var3._M_pi)->super_peer_class_set).m_class.
      super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
      ._M_elems + 3) = local_48;
    *(peer_connection_handle **)
     ((((torrent *)_Var3._M_pi)->super_peer_class_set).m_class.
      super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
      ._M_elems + 5) = pc;
    local_58 = puVar4;
    _Stack_50._M_pi = _Var3._M_pi;
    ::std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&stack0xffffffffffffffc0);
    p_Var1 = (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      (((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_torrent_file.
      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)puVar4;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(((torrent *)_Var3._M_pi)->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&stack0xffffffffffffffb0);
      puVar4 = local_58;
      _Var3._M_pi = _Stack_50._M_pi;
    }
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_torrent_plugin)._vptr_torrent_plugin = (_func_int **)puVar4;
    this->m_torrent = (torrent *)_Var3._M_pi;
    local_58 = (unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffb0);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    this->super_torrent_plugin = (_func_int **)0x0;
    this->m_torrent = (torrent *)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::peer_plugin>)
         sVar5.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<peer_plugin> ut_metadata_plugin::new_connection(
		peer_connection_handle const& pc)
	{
		if (pc.type() != connection_type::bittorrent) return {};

		aux::bt_peer_connection* c = static_cast<aux::bt_peer_connection*>(pc.native_handle().get());
		return std::make_shared<ut_metadata_peer_plugin>(m_torrent, *c, *this);
	}